

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

int8_t __thiscall wasm::Random::get(Random *this)

{
  size_type sVar1;
  size_type sVar2;
  byte *pbVar3;
  Random *this_local;
  
  sVar1 = this->pos;
  sVar2 = std::vector<char,_std::allocator<char>_>::size(&this->bytes);
  if (sVar1 == sVar2) {
    this->finishedInput = true;
    this->pos = 0;
    this->xorFactor = this->xorFactor + 1;
  }
  sVar1 = this->pos;
  this->pos = sVar1 + 1;
  pbVar3 = (byte *)std::vector<char,_std::allocator<char>_>::operator[](&this->bytes,sVar1);
  return *pbVar3 ^ (byte)this->xorFactor;
}

Assistant:

int8_t Random::get() {
  if (pos == bytes.size()) {
    // We ran out of input; go back to the start for more.
    finishedInput = true;
    pos = 0;
    xorFactor++;
  }
  return bytes[pos++] ^ xorFactor;
}